

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a5d8eb::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  bool bVar1;
  byte bVar2;
  reference pbVar3;
  cmMakefile *pcVar4;
  string *str;
  char *pcVar5;
  _Ios_Openmode _Var6;
  string local_540;
  cmAlphaNum local_520;
  cmAlphaNum local_4f0;
  undefined1 local_4c0 [8];
  string error_1;
  string local_490 [32];
  string_view local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_450;
  undefined1 local_440 [8];
  string message;
  cmAlphaNum local_400;
  cmAlphaNum local_3d0;
  undefined1 local_3a0 [8];
  string error;
  ofstream file;
  Status SStack_170;
  mode_t newMode;
  byte local_165;
  mode_t local_164;
  bool writable;
  Status SStack_160;
  mode_t mode;
  undefined1 local_158 [8];
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string e;
  cmAlphaNum local_e8;
  cmAlphaNum local_b8;
  string local_88;
  undefined1 local_58 [8];
  string fileName;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  cmExecutionStatus *status_local;
  bool append_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)status;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  fileName.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar3);
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  bVar1 = cmsys::SystemTools::FileIsFullPath(pbVar3);
  if (!bVar1) {
    pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)i._M_current);
    str = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4);
    cmAlphaNum::cmAlphaNum(&local_b8,str);
    cmAlphaNum::cmAlphaNum(&local_e8,'/');
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    cmStrCat<std::__cxx11::string>(&local_88,&local_b8,&local_e8,pbVar3);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  e.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)i._M_current);
  bVar1 = cmMakefile::CanIWriteThisFile(pcVar4,(string *)local_58);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)local_158,(string *)local_58);
    SStack_160 = cmsys::SystemTools::MakeDirectory((string *)local_158,(mode_t *)0x0);
    local_164 = 0;
    local_165 = 0;
    SStack_170 = cmsys::SystemTools::GetPermissions((string *)local_58,&local_164);
    bVar1 = cmsys::Status::operator_cast_to_bool(&stack0xfffffffffffffe90);
    if (bVar1) {
      local_165 = (local_164 & 0x80) != 0;
      if (!(bool)local_165) {
        cmsys::SystemTools::SetPermissions((string *)local_58,local_164 | 0x90,false);
      }
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var6 = _S_out;
    if (append) {
      _Var6 = _S_app;
    }
    std::ofstream::ofstream((void *)((long)&error.field_2 + 8),pcVar5,_Var6);
    bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    if ((bVar2 & 1) == 0) {
      local_458._M_current = local_30._M_current;
      local_460 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(args);
      local_450 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_458,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_460);
      std::__cxx11::string::string(local_490);
      local_470 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_490);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)((long)&error_1.field_2 + 8));
      cmJoin((string *)local_440,&local_450,local_470,stack0xfffffffffffffb60);
      std::__cxx11::string::~string(local_490);
      std::operator<<((ostream *)((long)&error.field_2 + 8),(string *)local_440);
      bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                         *(long *)(error.field_2._8_8_ + -0x18) + 8));
      if ((bVar2 & 1) == 0) {
        std::ofstream::close();
        if ((local_164 != 0) && ((local_165 & 1) == 0)) {
          cmsys::SystemTools::SetPermissions((string *)local_58,local_164,false);
        }
        args_local._7_1_ = true;
        dir.field_2._12_4_ = 1;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_4f0,"write failed (");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmAlphaNum::cmAlphaNum(&local_520,&local_540);
        cmStrCat<char[6],std::__cxx11::string>
                  ((string *)local_4c0,&local_4f0,&local_520,(char (*) [6])"):\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        std::__cxx11::string::~string((string *)&local_540);
        cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_4c0);
        args_local._7_1_ = false;
        dir.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_4c0);
      }
      std::__cxx11::string::~string((string *)local_440);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_3d0,"failed to open for writing (");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmAlphaNum::cmAlphaNum(&local_400,(string *)((long)&message.field_2 + 8));
      cmStrCat<char[6],std::__cxx11::string>
                ((string *)local_3a0,&local_3d0,&local_400,(char (*) [6])"):\n  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_3a0);
      args_local._7_1_ = false;
      dir.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_3a0);
    }
    std::ofstream::~ofstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_158);
  }
  else {
    std::operator+(&local_130,"attempted to write a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   &local_130," into a source directory.");
    std::__cxx11::string::~string((string *)&local_130);
    cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_110);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = false;
    dir.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_110);
  }
  std::__cxx11::string::~string((string *)local_58);
  return args_local._7_1_;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}